

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_mllr.c
# Opt level: O0

ps_mllr_t * ps_mllr_read(char *regmatfile)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  int local_3c;
  int local_38;
  int k;
  int j;
  int m;
  int i;
  int n;
  FILE *fp;
  ps_mllr_t *mllr;
  char *regmatfile_local;
  
  mllr = (ps_mllr_t *)regmatfile;
  fp = (FILE *)__ckd_calloc__(1,0x38,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                              ,0x36);
  fp->_flags = 1;
  _i = fopen((char *)mllr,"r");
  if (_i == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                   ,0x3a,"Failed to open MLLR file \'%s\' for reading",mllr);
  }
  else {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
            ,0x3e,"Reading MLLR transformation file \'%s\'\n",mllr);
    iVar1 = __isoc99_fscanf(_i,"%d",&m);
    if ((iVar1 == 1) && (0 < m)) {
      *(int *)&fp->field_0x4 = m;
      iVar1 = __isoc99_fscanf(_i,"%d",&m);
      if (iVar1 == 1) {
        *(int *)&fp->_IO_read_ptr = m;
        pcVar2 = (char *)__ckd_calloc__((long)*(int *)&fp->_IO_read_ptr,4,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                                        ,0x4b);
        fp->_IO_read_end = pcVar2;
        pcVar2 = (char *)__ckd_calloc__((long)*(int *)&fp->_IO_read_ptr,8,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                                        ,0x4d);
        fp->_IO_read_base = pcVar2;
        pcVar2 = (char *)__ckd_calloc__((long)*(int *)&fp->_IO_read_ptr,8,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                                        ,0x4e);
        fp->_IO_write_base = pcVar2;
        pcVar2 = (char *)__ckd_calloc__((long)*(int *)&fp->_IO_read_ptr,8,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                                        ,0x4f);
        fp->_IO_write_ptr = pcVar2;
        j = 0;
        while( true ) {
          if (*(int *)&fp->_IO_read_ptr <= j) {
            fclose(_i);
            return (ps_mllr_t *)fp;
          }
          iVar1 = __isoc99_fscanf(_i,"%d",&m);
          if (iVar1 != 1) break;
          *(int *)(fp->_IO_read_end + (long)j * 4) = m;
          pvVar3 = __ckd_calloc_3d__((long)*(int *)&fp->field_0x4,
                                     (long)*(int *)(fp->_IO_read_end + (long)j * 4),
                                     (long)*(int *)(fp->_IO_read_end + (long)j * 4),4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                                     ,0x59);
          *(void **)(fp->_IO_read_base + (long)j * 8) = pvVar3;
          pvVar3 = __ckd_calloc_2d__((long)*(int *)&fp->field_0x4,
                                     (long)*(int *)(fp->_IO_read_end + (long)j * 4),4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                                     ,0x5c);
          *(void **)(fp->_IO_write_base + (long)j * 8) = pvVar3;
          pvVar3 = __ckd_calloc_2d__((long)*(int *)&fp->field_0x4,
                                     (long)*(int *)(fp->_IO_read_end + (long)j * 4),4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                                     ,0x5f);
          *(void **)(fp->_IO_write_ptr + (long)j * 8) = pvVar3;
          for (k = 0; k < *(int *)&fp->field_0x4; k = k + 1) {
            for (local_38 = 0; local_38 < *(int *)(fp->_IO_read_end + (long)j * 4);
                local_38 = local_38 + 1) {
              for (local_3c = 0; local_3c < *(int *)(fp->_IO_read_end + (long)j * 4);
                  local_3c = local_3c + 1) {
                iVar1 = __isoc99_fscanf(_i,"%f ",*(long *)(*(long *)(*(long *)(fp->_IO_read_base +
                                                                              (long)j * 8) +
                                                                    (long)k * 8) +
                                                          (long)local_38 * 8) + (long)local_3c * 4);
                if (iVar1 != 1) {
                  err_msg(ERR_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                          ,0x66,"Failed reading MLLR rotation (%d,%d,%d,%d)\n",(ulong)(uint)j,
                          (ulong)(uint)k,local_38,local_3c);
                  goto LAB_00161038;
                }
              }
            }
            for (local_38 = 0; local_38 < *(int *)(fp->_IO_read_end + (long)j * 4);
                local_38 = local_38 + 1) {
              iVar1 = __isoc99_fscanf(_i,"%f ",*(long *)(*(long *)(fp->_IO_write_base + (long)j * 8)
                                                        + (long)k * 8) + (long)local_38 * 4);
              if (iVar1 != 1) {
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                        ,0x6e,"Failed reading MLLR bias (%d,%d,%d)\n",(ulong)(uint)j,(ulong)(uint)k,
                        local_38);
                goto LAB_00161038;
              }
            }
            for (local_38 = 0; local_38 < *(int *)(fp->_IO_read_end + (long)j * 4);
                local_38 = local_38 + 1) {
              iVar1 = __isoc99_fscanf(_i,"%f ",*(long *)(*(long *)(fp->_IO_write_ptr + (long)j * 8)
                                                        + (long)k * 8) + (long)local_38 * 4);
              if (iVar1 != 1) {
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                        ,0x75,"Failed reading MLLR variance scale (%d,%d,%d)\n",(ulong)(uint)j,
                        (ulong)(uint)k,local_38);
                goto LAB_00161038;
              }
            }
          }
          j = j + 1;
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                ,0x53,"Failed to read stream length for feature %d\n",(ulong)(uint)j);
      }
      else {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
                ,0x47,"Failed to read number of feature streams\n");
      }
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_mllr.c"
              ,0x41,"Failed to read number of MLLR classes\n");
    }
  }
LAB_00161038:
  if (_i != (FILE *)0x0) {
    fclose(_i);
  }
  ps_mllr_free((ps_mllr_t *)fp);
  return (ps_mllr_t *)0x0;
}

Assistant:

ps_mllr_t *
ps_mllr_read(char const *regmatfile)
{
    ps_mllr_t *mllr;
    FILE *fp;
    int n, i, m, j, k;

    mllr = ckd_calloc(1, sizeof(*mllr));
    mllr->refcnt = 1;

    if ((fp = fopen(regmatfile, "r")) == NULL) {
        E_ERROR_SYSTEM("Failed to open MLLR file '%s' for reading", regmatfile);
        goto error_out;
    }
    else
        E_INFO("Reading MLLR transformation file '%s'\n", regmatfile);

    if ((fscanf(fp, "%d", &n) != 1) || (n < 1)) {
        E_ERROR("Failed to read number of MLLR classes\n");
        goto error_out;
    }
    mllr->n_class = n;

    if ((fscanf(fp, "%d", &n) != 1)) {
        E_ERROR("Failed to read number of feature streams\n");
        goto error_out;
    }
    mllr->n_feat = n;
    mllr->veclen = ckd_calloc(mllr->n_feat, sizeof(*mllr->veclen));

    mllr->A = (float32 ****) ckd_calloc(mllr->n_feat, sizeof(float32 **));
    mllr->b = (float32 ***) ckd_calloc(mllr->n_feat, sizeof(float32 *));
    mllr->h = (float32 ***) ckd_calloc(mllr->n_feat, sizeof(float32 *));

    for (i = 0; i < mllr->n_feat; ++i) {
        if (fscanf(fp, "%d", &n) != 1) {
            E_ERROR("Failed to read stream length for feature %d\n", i);
            goto error_out;
        }
        mllr->veclen[i] = n;
        mllr->A[i] =
            (float32 ***) ckd_calloc_3d(mllr->n_class, mllr->veclen[i],
                                        mllr->veclen[i], sizeof(float32));
        mllr->b[i] =
            (float32 **) ckd_calloc_2d(mllr->n_class, mllr->veclen[i],
                                       sizeof(float32));
        mllr->h[i] =
            (float32 **) ckd_calloc_2d(mllr->n_class, mllr->veclen[i],
                                       sizeof(float32));

        for (m = 0; m < mllr->n_class; ++m) {
            for (j = 0; j < mllr->veclen[i]; ++j) {
                for (k = 0; k < mllr->veclen[i]; ++k) {
                    if (fscanf(fp, "%f ", &mllr->A[i][m][j][k]) != 1) {
                        E_ERROR("Failed reading MLLR rotation (%d,%d,%d,%d)\n",
                                i, m, j, k);
                        goto error_out;
                    }
                }
            }
            for (j = 0; j < mllr->veclen[i]; ++j) {
                if (fscanf(fp, "%f ", &mllr->b[i][m][j]) != 1) {
                    E_ERROR("Failed reading MLLR bias (%d,%d,%d)\n",
                            i, m, j);
                    goto error_out;
                }
            }
            for (j = 0; j < mllr->veclen[i]; ++j) {
                if (fscanf(fp, "%f ", &mllr->h[i][m][j]) != 1) {
                    E_ERROR("Failed reading MLLR variance scale (%d,%d,%d)\n",
                            i, m, j);
                    goto error_out;
                }
            }
        }
    }
    fclose(fp);
    return mllr;

error_out:
    if (fp)
        fclose(fp);
    ps_mllr_free(mllr);
    return NULL;
}